

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

_Bool openssh_new_write(Filename *filename,ssh2_userkey *ukey,char *passphrase)

{
  BinarySink *bs;
  ssh_key *psVar1;
  strbuf *buf_o;
  strbuf *buf_o_00;
  strbuf *buf_o_01;
  strbuf *psVar2;
  ssh_cipher *psVar3;
  FILE *__stream;
  uchar val;
  ulong val_00;
  BinarySink *bs_00;
  ptrlen salt;
  ptrlen pVar4;
  uchar bcrypt_salt [16];
  uint8_t checkint_buf [4];
  uchar keybuf [48];
  
  psVar1 = (*ukey->key->vt->base_key)(ukey->key);
  buf_o = strbuf_new();
  (*psVar1->vt->public_blob)(psVar1,buf_o->binarysink_);
  buf_o_00 = strbuf_new_nm();
  (*psVar1->vt->openssh_blob)(psVar1,buf_o_00->binarysink_);
  buf_o_01 = strbuf_new_nm();
  bs = buf_o_01->binarysink_;
  BinarySink_put_asciz(bs,"openssh-key-v1");
  if (passphrase == (char *)0x0) {
    bcrypt_salt[0] = '\0';
    bcrypt_salt[1] = '\0';
    bcrypt_salt[2] = '\0';
    bcrypt_salt[3] = '\0';
    bcrypt_salt[4] = '\0';
    bcrypt_salt[5] = '\0';
    bcrypt_salt[6] = '\0';
    bcrypt_salt[7] = '\0';
    bcrypt_salt[8] = '\0';
    bcrypt_salt[9] = '\0';
    bcrypt_salt[10] = '\0';
    bcrypt_salt[0xb] = '\0';
    bcrypt_salt[0xc] = '\0';
    bcrypt_salt[0xd] = '\0';
    bcrypt_salt[0xe] = '\0';
    bcrypt_salt[0xf] = '\0';
    BinarySink_put_stringz(bs,"none");
    BinarySink_put_stringz(bs,"none");
    BinarySink_put_stringz(bs,"");
  }
  else {
    random_read(bcrypt_salt,0x10);
    BinarySink_put_stringz(bs,"aes256-ctr");
    BinarySink_put_stringz(bs,"bcrypt");
    psVar2 = strbuf_new_nm();
    BinarySink_put_string(psVar2->binarysink_,bcrypt_salt,0x10);
    BinarySink_put_uint32(psVar2->binarysink_,0x10);
    BinarySink_put_stringsb(bs,psVar2);
  }
  BinarySink_put_uint32(bs,1);
  BinarySink_put_string(bs,buf_o->s,buf_o->len);
  psVar2 = strbuf_new_nm();
  random_read(checkint_buf,4);
  val_00 = (ulong)((uint)checkint_buf >> 0x18 | ((uint)checkint_buf & 0xff0000) >> 8 |
                   ((uint)checkint_buf & 0xff00) << 8 | (int)checkint_buf << 0x18);
  bs_00 = psVar2->binarysink_;
  BinarySink_put_uint32(bs_00,val_00);
  BinarySink_put_uint32(bs_00,val_00);
  BinarySink_put_stringz(bs_00,psVar1->vt->ssh_id);
  BinarySink_put_data(bs_00,buf_o_00->s,buf_o_00->len);
  BinarySink_put_stringz(bs_00,ukey->comment);
  val = '\x01';
  do {
    BinarySink_put_byte(bs_00,val);
    val = val + '\x01';
  } while ((psVar2->len & 0xf) != 0);
  if (passphrase != (char *)0x0) {
    pVar4 = ptrlen_from_asciz(passphrase);
    salt.len = 0x10;
    salt.ptr = bcrypt_salt;
    openssh_bcrypt(pVar4,salt,0x10,keybuf,0x30);
    psVar3 = aes_select(&ssh_aes256_sdctr);
    (*psVar3->vt->setkey)(psVar3,keybuf);
    (*psVar3->vt->setiv)(psVar3,keybuf + 0x20);
    (*psVar3->vt->encrypt)(psVar3,psVar2->u,(int)psVar2->len);
    (*psVar3->vt->free)(psVar3);
    smemclr(keybuf,0x30);
  }
  BinarySink_put_stringsb(bs,psVar2);
  __stream = (FILE *)f_open(filename,"wb",true);
  if (__stream == (FILE *)0x0) {
    if (buf_o_01 == (strbuf *)0x0) goto LAB_001145ff;
  }
  else {
    fputs("-----BEGIN OPENSSH PRIVATE KEY-----\n",__stream);
    pVar4.ptr = buf_o_01->u;
    pVar4.len = buf_o_01->len;
    base64_encode_fp((FILE *)__stream,pVar4,0x40);
    fputs("-----END OPENSSH PRIVATE KEY-----\n",__stream);
    fclose(__stream);
  }
  strbuf_free(buf_o_01);
LAB_001145ff:
  strbuf_free(buf_o_00);
  strbuf_free(buf_o);
  return __stream != (FILE *)0x0;
}

Assistant:

static bool openssh_new_write(
    const Filename *filename, ssh2_userkey *ukey, const char *passphrase)
{
    strbuf *pubblob, *privblob, *cblob;
    int padvalue;
    unsigned checkint;
    bool ret = false;
    unsigned char bcrypt_salt[16];
    const int bcrypt_rounds = 16;
    FILE *fp;

    /* OpenSSH's private key files never contain a certificate, so
     * revert to the underlying base key if necessary */
    ssh_key *key = ssh_key_base_key(ukey->key);

    /*
     * Fetch the key blobs and find out the lengths of things.
     */
    pubblob = strbuf_new();
    ssh_key_public_blob(key, BinarySink_UPCAST(pubblob));
    privblob = strbuf_new_nm();
    ssh_key_openssh_blob(key, BinarySink_UPCAST(privblob));

    /*
     * Construct the cleartext version of the blob.
     */
    cblob = strbuf_new_nm();

    /* Magic number. */
    put_asciz(cblob, "openssh-key-v1");

    /* Cipher and kdf names, and kdf options. */
    if (!passphrase) {
        memset(bcrypt_salt, 0, sizeof(bcrypt_salt)); /* prevent warnings */
        put_stringz(cblob, "none");
        put_stringz(cblob, "none");
        put_stringz(cblob, "");
    } else {
        strbuf *substr;

        random_read(bcrypt_salt, sizeof(bcrypt_salt));
        put_stringz(cblob, "aes256-ctr");
        put_stringz(cblob, "bcrypt");
        substr = strbuf_new_nm();
        put_string(substr, bcrypt_salt, sizeof(bcrypt_salt));
        put_uint32(substr, bcrypt_rounds);
        put_stringsb(cblob, substr);
    }

    /* Number of keys. */
    put_uint32(cblob, 1);

    /* Public blob. */
    put_string(cblob, pubblob->s, pubblob->len);

    /* Private section. */
    {
        strbuf *cpblob = strbuf_new_nm();

        /* checkint. */
        uint8_t checkint_buf[4];
        random_read(checkint_buf, 4);
        checkint = GET_32BIT_MSB_FIRST(checkint_buf);
        put_uint32(cpblob, checkint);
        put_uint32(cpblob, checkint);

        /* Private key. The main private blob goes inline, with no string
         * wrapper. */
        put_stringz(cpblob, ssh_key_ssh_id(key));
        put_data(cpblob, privblob->s, privblob->len);

        /* Comment. */
        put_stringz(cpblob, ukey->comment);

        /* Pad out the encrypted section. */
        padvalue = 1;
        do {
            put_byte(cpblob, padvalue++);
        } while (cpblob->len & 15);

        if (passphrase) {
            /*
             * Encrypt the private section. We need 48 bytes of key
             * material: 32 bytes AES key + 16 bytes iv.
             */
            unsigned char keybuf[48];
            ssh_cipher *cipher;

            openssh_bcrypt(ptrlen_from_asciz(passphrase),
                           make_ptrlen(bcrypt_salt, sizeof(bcrypt_salt)),
                           bcrypt_rounds, keybuf, sizeof(keybuf));

            cipher = ssh_cipher_new(&ssh_aes256_sdctr);
            ssh_cipher_setkey(cipher, keybuf);
            ssh_cipher_setiv(cipher, keybuf + 32);
            ssh_cipher_encrypt(cipher, cpblob->u, cpblob->len);
            ssh_cipher_free(cipher);

            smemclr(keybuf, sizeof(keybuf));
        }

        put_stringsb(cblob, cpblob);
    }

    /*
     * And save it. We'll use Unix line endings just in case it's
     * subsequently transferred in binary mode.
     */
    fp = f_open(filename, "wb", true);      /* ensure Unix line endings */
    if (!fp)
        goto error;
    fputs("-----BEGIN OPENSSH PRIVATE KEY-----\n", fp);
    base64_encode_fp(fp, ptrlen_from_strbuf(cblob), 64);
    fputs("-----END OPENSSH PRIVATE KEY-----\n", fp);
    fclose(fp);
    ret = true;

    error:
    if (cblob)
        strbuf_free(cblob);
    if (privblob)
        strbuf_free(privblob);
    if (pubblob)
        strbuf_free(pubblob);
    return ret;
}